

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Flate.cc
# Opt level: O2

void __thiscall Pl_Flate::~Pl_Flate(Pl_Flate *this)

{
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pl_Flate_002ac460;
  std::unique_ptr<Pl_Flate::Members,_std::default_delete<Pl_Flate::Members>_>::~unique_ptr(&this->m)
  ;
  Pipeline::~Pipeline(&this->super_Pipeline);
  return;
}

Assistant:

Pl_Flate::~Pl_Flate() = default;